

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c
# Opt level: O0

void postfix_identifier(ch_compilation *comp,ch_token name)

{
  _Bool _Var1;
  undefined4 local_3c;
  undefined4 local_38;
  ch_op op_2;
  ch_op op_1;
  ch_op op;
  ch_token operator;
  ch_compilation *comp_local;
  
  operator._24_8_ = comp;
  _Var1 = opt_consume(comp,TK_PLUS_PLUS,(ch_token *)&op_1);
  if ((_Var1) ||
     (_Var1 = opt_consume((ch_compilation *)operator._24_8_,TK_MINUS_MINUS,(ch_token *)&op_1), _Var1
     )) {
    op_2 = OP_TOP;
    ch_emit_write(*(ch_blob **)(operator._24_8_ + 0x70),&op_2,1);
    if (op_1 == OP_NEGATE) {
      local_38 = 7;
      ch_emit_write(*(ch_blob **)(operator._24_8_ + 0x70),&local_38,1);
    }
    else {
      local_3c = 9;
      ch_emit_write(*(ch_blob **)(operator._24_8_ + 0x70),&local_3c,1);
    }
    set_variable((ch_compilation *)operator._24_8_,name.lexeme);
  }
  return;
}

Assistant:

void postfix_identifier(ch_compilation* comp, ch_token name) {
  // The identifier should already be loaded on the stack when this function is called
  ch_token operator;
  if (opt_consume(comp, TK_PLUS_PLUS, &operator) || opt_consume(comp, TK_MINUS_MINUS, &operator)) {
    EMIT_OP(GET_EMIT(comp), OP_TOP);
    if (operator.kind == TK_PLUS_PLUS) {
      EMIT_OP(GET_EMIT(comp), OP_ADDONE);
    } else {
      EMIT_OP(GET_EMIT(comp), OP_SUBONE);
    }
    set_variable(comp, name.lexeme);
  }
}